

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
          (TriangleInterpolationTest *this,Context *ctx,char *name,char *desc,GLenum primitive,
          int flags,RenderTarget renderTarget,int numSamples)

{
  int flags_local;
  GLenum primitive_local;
  char *desc_local;
  char *name_local;
  Context *ctx_local;
  TriangleInterpolationTest *this_local;
  
  BaseRenderingCase::BaseRenderingCase
            (&this->super_BaseRenderingCase,ctx,name,desc,renderTarget,numSamples,0x100);
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleInterpolationTest_03288438;
  *(GLenum *)&(this->super_BaseRenderingCase).field_0xc4 = primitive;
  this->m_projective = (flags & 2U) != 0;
  this->m_iterationCount = 3;
  this->m_iteration = 0;
  this->m_allIterationsPassed = true;
  (this->super_BaseRenderingCase).m_flatshade = (flags & 4U) != 0;
  return;
}

Assistant:

TriangleInterpolationTest::TriangleInterpolationTest (Context& ctx, const char* name, const char* desc, glw::GLenum primitive, int flags, RenderTarget renderTarget, int numSamples)
	: BaseRenderingCase		(ctx, name, desc, renderTarget, numSamples, DEFAULT_RENDER_SIZE)
	, m_primitive			(primitive)
	, m_projective			((flags & INTERPOLATIONFLAGS_PROJECTED) != 0)
	, m_iterationCount		(3)
	, m_iteration			(0)
	, m_allIterationsPassed	(true)
{
	m_flatshade = ((flags & INTERPOLATIONFLAGS_FLATSHADE) != 0);
}